

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

RemotePromise<capnp::AnyPointer> * __thiscall
capnp::LocalRequest::sendImpl
          (RemotePromise<capnp::AnyPointer> *__return_storage_ptr__,LocalRequest *this,
          bool isStreaming)

{
  CallHints CVar1;
  ushort uVar2;
  uint64_t uVar3;
  ClientHook *pCVar4;
  MallocMessageBuilder *pMVar5;
  char *pcVar6;
  long *plVar7;
  LocalCallContext *ptrCopy;
  Refcounted *refcounted;
  Fault f;
  DebugComparison<capnp::MallocMessageBuilder_*,_std::nullptr_t> _kjCondition;
  PromiseNode *local_38;
  void *continuationTracePtr;
  
  _kjCondition.left = (this->message).ptr;
  _kjCondition.right = (void *)0x0;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left != (MallocMessageBuilder *)0x0;
  if (_kjCondition.result) {
    (*((this->client).ptr)->_vptr_ClientHook[4])(&_kjCondition);
    plVar7 = (long *)operator_new(0xa8);
    CVar1 = this->hints;
    *plVar7 = (long)&PTR_getParams_0037bc30;
    plVar7[1] = (long)&PTR__LocalCallContext_0037bc90;
    plVar7[2] = (long)&PTR_disposeImpl_0037bcb0;
    pMVar5 = (this->message).ptr;
    plVar7[4] = (long)(this->message).disposer;
    plVar7[5] = (long)pMVar5;
    (this->message).ptr = (MallocMessageBuilder *)0x0;
    *(undefined1 *)(plVar7 + 6) = 0;
    plVar7[0xd] = 0;
    plVar7[0xe] = 0;
    plVar7[0xf] = 0;
    *(undefined4 *)(plVar7 + 0x10) = _kjCondition.left._0_4_;
    *(undefined4 *)((long)plVar7 + 0x84) = _kjCondition.left._4_4_;
    *(undefined4 *)(plVar7 + 0x11) = _kjCondition.right._0_4_;
    *(undefined4 *)((long)plVar7 + 0x8c) = _kjCondition.right._4_4_;
    plVar7[0x12] = 0;
    plVar7[0x13] = 0;
    *(CallHints *)(plVar7 + 0x14) = CVar1;
    *(bool *)((long)plVar7 + 0xa2) = isStreaming;
    uVar3 = this->interfaceId;
    pCVar4 = (this->client).ptr;
    uVar2 = this->methodId;
    *(undefined4 *)(plVar7 + 3) = 2;
    f.exception = (Exception *)(plVar7 + 2);
    (*pCVar4->_vptr_ClientHook[1])(&_kjCondition,pCVar4,uVar3,(ulong)uVar2);
    if (plVar7 != (long *)0x0) {
      (**(code **)((f.exception)->ownFile).content.ptr)
                (f.exception,(long)plVar7 + *(long *)(*plVar7 + -0x10));
    }
    continuationTracePtr =
         kj::_::
         SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:271:52)>
         ::anon_class_16_1_bc11688f_for_func::operator();
    f.exception = (Exception *)(plVar7 + 2);
    kj::_::PromiseDisposer::
    appendPromise<kj::_::SimpleTransformPromiseNode<void,capnp::LocalRequest::sendImpl(bool)::_lambda()_1_>,kj::_::PromiseDisposer,capnp::LocalRequest::sendImpl(bool)::_lambda()_1_,void*&>
              ((PromiseDisposer *)&local_38,(OwnPromiseNode *)&_kjCondition,
               (anon_class_16_1_bc11688f_for_func *)&f,&continuationTracePtr);
    if (plVar7 != (long *)0x0) {
      (**(code **)((f.exception)->ownFile).content.ptr)
                (f.exception,(long)plVar7 + *(long *)(*plVar7 + -0x10));
    }
    pcVar6 = _kjCondition.op.content.ptr;
    pMVar5 = _kjCondition.left;
    (__return_storage_ptr__->super_Promise<capnp::Response<capnp::AnyPointer>_>).super_PromiseBase.
    node.ptr = local_38;
    _kjCondition.op.content.ptr = (char *)0x0;
    (__return_storage_ptr__->super_Pipeline).hook.disposer = (Disposer *)_kjCondition.right;
    (__return_storage_ptr__->super_Pipeline).hook.ptr = (PipelineHook *)pcVar6;
    (__return_storage_ptr__->super_Pipeline).ops.ptr = (PipelineOp *)0x0;
    (__return_storage_ptr__->super_Pipeline).ops.size_ = 0;
    (__return_storage_ptr__->super_Pipeline).ops.disposer = (ArrayDisposer *)0x0;
    if (_kjCondition.left != (MallocMessageBuilder *)0x0) {
      _kjCondition.left = (MallocMessageBuilder *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pMVar5);
    }
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::MallocMessageBuilder*,decltype(nullptr)>&,char_const(&)[39]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
             ,0x109,FAILED,"message.get() != nullptr",
             "_kjCondition,\"Already called send() on this request.\"",&_kjCondition,
             (char (*) [39])"Already called send() on this request.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

QueuedPipeline(kj::Promise<kj::Own<PipelineHook>>&& promiseParam)
      : promise(promiseParam.fork()),
        selfResolutionOp(promise.addBranch().then([this](kj::Own<PipelineHook>&& inner) {
          redirect = kj::mv(inner);
        }, [this](kj::Exception&& exception) {
          redirect = newBrokenPipeline(kj::mv(exception));
        }).eagerlyEvaluate(nullptr)) {}